

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O3

void test_secp256r1_sign(void)

{
  int iVar1;
  uECC_Curve curve;
  ptls_iovec_t input;
  uint8_t priv [32];
  uint8_t pub [65];
  uint32_t sigbuf_small [128];
  uint8_t auStack_2a8 [32];
  ptls_buffer_t local_288;
  uint8_t local_268 [80];
  uint8_t local_218 [520];
  
  curve = uECC_secp256r1();
  uECC_make_key(local_268,auStack_2a8,curve);
  local_288.base = local_218;
  local_288.off = 0;
  local_288.capacity = 0x200;
  local_288.is_allocated = 0;
  input.len = 0x20;
  input.base = (uint8_t *)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
  iVar1 = secp256r1sha256_sign(auStack_2a8,&local_288,input);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/minicrypto.c",
      0x32);
  ptls_buffer__release_memory(&local_288);
  return;
}

Assistant:

static void test_secp256r1_sign(void)
{
    const char *msg = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdef";
    uint8_t pub[SECP256R1_PUBLIC_KEY_SIZE], priv[SECP256R1_PRIVATE_KEY_SIZE];
    ptls_buffer_t sigbuf;
    uint32_t sigbuf_small[128];

    uECC_make_key(pub, priv, uECC_secp256r1());
    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));

    ok(secp256r1sha256_sign(priv, &sigbuf, ptls_iovec_init(msg, 32)) == 0);

    /* FIXME verify sign */

    ptls_buffer_dispose(&sigbuf);
}